

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

char * vkb::to_string(InstanceError err)

{
  if (err < (windowing_extensions_not_present|vulkan_version_unavailable)) {
    return (&PTR_anon_var_dwarf_48066_0011fcb8)[err];
  }
  return "";
}

Assistant:

const char* to_string(InstanceError err) {
    switch (err) {
        CASE_TO_STRING(InstanceError, vulkan_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_1_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_2_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_3_unavailable)
        CASE_TO_STRING(InstanceError, vulkan_version_1_4_unavailable)
        CASE_TO_STRING(InstanceError, failed_create_debug_messenger)
        CASE_TO_STRING(InstanceError, failed_create_instance)
        CASE_TO_STRING(InstanceError, requested_layers_not_present)
        CASE_TO_STRING(InstanceError, requested_extensions_not_present)
        CASE_TO_STRING(InstanceError, windowing_extensions_not_present)
        default:
            return "";
    }
}